

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void google::protobuf::internal::DynamicMapField::ClearMapNoSyncImpl(MapFieldBase *base)

{
  bool bVar1;
  Arena *pAVar2;
  reference pvVar3;
  value_type *elem;
  iterator __end3;
  iterator __begin3;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *__range3;
  DynamicMapField *self;
  MapFieldBase *base_local;
  
  pAVar2 = MapFieldBase::arena(base);
  if (pAVar2 == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((iterator *)&__end3.super_UntypedMapIterator.bucket_index_,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(base + 1));
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((iterator *)&elem,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(base + 1));
    while (bVar1 = protobuf::operator!=
                             ((iterator *)&__end3.super_UntypedMapIterator.bucket_index_,
                              (iterator *)&elem), bVar1) {
      pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator*
                         ((iterator *)&__end3.super_UntypedMapIterator.bucket_index_);
      MapValueRef::DeleteData(&pvVar3->second);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
                ((iterator *)&__end3.super_UntypedMapIterator.bucket_index_);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(base + 1));
  return;
}

Assistant:

void DynamicMapField::ClearMapNoSyncImpl(MapFieldBase& base) {
  auto& self = static_cast<DynamicMapField&>(base);
  if (self.arena() == nullptr) {
    for (auto& elem : self.map_) {
      elem.second.DeleteData();
    }
  }

  self.map_.clear();
}